

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_deep_copy_non_container
          (t_java_generator *this,ostream *out,string *source_name,string dest_name,t_type *type)

{
  int iVar1;
  t_type *ttype;
  ostream *poVar2;
  size_type sVar3;
  pointer pcVar4;
  t_type *in_R8;
  string local_48;
  
  ttype = t_type::get_true_type(in_R8);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
      if ((char)iVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"new ",4);
        type_name_abi_cxx11_(&local_48,this,ttype,true,true,false,false);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_48._M_dataplus._M_p,local_48._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        return;
      }
    }
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
  if ((char)iVar1 == '\0') {
    pcVar4 = (source_name->_M_dataplus)._M_p;
    sVar3 = source_name->_M_string_length;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"org.apache.thrift.TBaseHelper.copyBinary(",0x29);
    out = std::__ostream_insert<char,std::char_traits<char>>
                    (out,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
    pcVar4 = ")";
    sVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar3);
  return;
}

Assistant:

void t_java_generator::generate_deep_copy_non_container(ostream& out,
                                                        std::string source_name,
                                                        std::string dest_name,
                                                        t_type* type) {
  (void)dest_name;
  type = get_true_type(type);
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    if (type->is_binary()) {
      out << "org.apache.thrift.TBaseHelper.copyBinary(" << source_name << ")";
    } else {
      // everything else can be copied directly
      out << source_name;
    }
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}